

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::BindToCreateCase::iterate(BindToCreateCase *this)

{
  deUint32 *this_00;
  int iVar1;
  GLenum err;
  deUint32 array;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_01;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_1e8;
  MessageBuilder local_1d8;
  undefined1 local_48 [8];
  VertexArray vao;
  CallLogWrapper gl;
  GLenum error;
  GLuint buffer;
  BindToCreateCase *this_local;
  
  gl._20_4_ = 0;
  pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  this_01 = gles31::Context::getTestContext((this->super_TestCase).m_context);
  pTVar3 = tcu::TestContext::getLog(this_01);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,
             (Functions *)CONCAT44(extraout_var,iVar1),pTVar3);
  pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_48,pRVar2);
  this_00 = &vao.super_ObjectWrapper.m_object;
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)this_00,true);
  glu::CallLogWrapper::glGenBuffers((CallLogWrapper *)this_00,1,(GLuint *)&gl.field_0x14);
  glu::CallLogWrapper::glDeleteBuffers
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,1,(GLuint *)&gl.field_0x14);
  err = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object);
  glu::checkError(err,"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x570);
  array = glu::ObjectWrapper::operator*((ObjectWrapper *)local_48);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,array);
  glu::CallLogWrapper::glBindVertexBuffer
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0,gl._20_4_,0,0);
  gl._16_4_ = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object);
  if (gl._16_4_ == 0x502) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1d8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1d8,(char (*) [43])"ERROR! Expected GL_INVALID_OPERATION, got ");
    EVar5 = glu::getErrorStr(gl._16_4_);
    local_1e8.m_getName = EVar5.m_getName;
    local_1e8.m_value = EVar5.m_value;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1e8);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d8);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Invalid error");
  }
  glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_48);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)&vao.super_ObjectWrapper.m_object);
  return STOP;
}

Assistant:

BindToCreateCase::IterateResult BindToCreateCase::iterate (void)
{
	glw::GLuint			buffer	= 0;
	glw::GLenum			error;
	glu::CallLogWrapper gl		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	glu::VertexArray	vao		(m_context.getRenderContext());

	gl.enableLogging(true);

	gl.glGenBuffers(1, &buffer);
	gl.glDeleteBuffers(1, &buffer);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "");

	gl.glBindVertexArray(*vao);
	gl.glBindVertexBuffer(0, buffer, 0, 0);

	error = gl.glGetError();

	if (error != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "ERROR! Expected GL_INVALID_OPERATION, got " << glu::getErrorStr(error) << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid error");
	}
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}